

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smtp.c
# Opt level: O0

CURLcode smtp_state_starttls_resp(Curl_easy *data,int smtpcode,smtpstate instate)

{
  CURLcode local_24;
  CURLcode result;
  smtpstate instate_local;
  int smtpcode_local;
  Curl_easy *data_local;
  
  if ((data->conn->proto).ftpc.pp.overflow == 0) {
    if (smtpcode == 0xdc) {
      local_24 = smtp_perform_upgrade_tls(data);
    }
    else if ((data->set).use_ssl == '\x01') {
      local_24 = smtp_perform_authentication(data);
    }
    else {
      Curl_failf(data,"STARTTLS denied, code %d",(ulong)(uint)smtpcode);
      local_24 = CURLE_USE_SSL_FAILED;
    }
    data_local._4_4_ = local_24;
  }
  else {
    data_local._4_4_ = CURLE_WEIRD_SERVER_REPLY;
  }
  return data_local._4_4_;
}

Assistant:

static CURLcode smtp_state_starttls_resp(struct Curl_easy *data,
                                         int smtpcode,
                                         smtpstate instate)
{
  CURLcode result = CURLE_OK;
  (void)instate; /* no use for this yet */

  /* Pipelining in response is forbidden. */
  if(data->conn->proto.smtpc.pp.overflow)
    return CURLE_WEIRD_SERVER_REPLY;

  if(smtpcode != 220) {
    if(data->set.use_ssl != CURLUSESSL_TRY) {
      failf(data, "STARTTLS denied, code %d", smtpcode);
      result = CURLE_USE_SSL_FAILED;
    }
    else
      result = smtp_perform_authentication(data);
  }
  else
    result = smtp_perform_upgrade_tls(data);

  return result;
}